

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::
     throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
               (char *args,time_point args_1,char *args_2,time_point args_3)

{
  runtime_error *this;
  stringstream msg;
  make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  amStack_1d8 [32];
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  detail::make_exception<const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  ::operator()(amStack_1d8,(stringstream *)local_1b8,args,args_1,args_2,args_3);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)amStack_1d8);
  *(undefined ***)this = &PTR__runtime_error_001b6a18;
  __cxa_throw(this,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}